

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

ssize_t __thiscall
ezc3d::DataNS::Points3dNS::Point::write(Point *this,int __fd,void *__buf,size_t __n)

{
  _Bit_type *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ssize_t sVar3;
  char *pcVar4;
  undefined4 in_register_00000034;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float zero;
  int minusOne;
  ulong local_48;
  int local_3c;
  float local_38;
  
  lVar5 = CONCAT44(in_register_00000034,__fd);
  local_38 = in_XMM0_Da;
  (*(this->super_Vector3d).super_Matrix._vptr_Matrix[0x28])();
  if (0.0 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
    iVar2 = (*(this->super_Vector3d).super_Matrix._vptr_Matrix[5])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      uVar9 = 0;
      do {
        local_48 = CONCAT44(local_48._4_4_,
                            (float)(this->super_Vector3d).super_Matrix._data.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar9]);
        std::ostream::write((char *)(lVar5 + 0x10),(long)&local_48);
        uVar9 = uVar9 + 1;
        iVar2 = (*(this->super_Vector3d).super_Matrix._vptr_Matrix[5])();
      } while (uVar9 < CONCAT44(extraout_var_00,iVar2));
    }
    p_Var1 = (this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar9 = ((long)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1)
            * 8 + (ulong)(this->_cameraMasks).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    if (uVar9 == 0) {
      local_48 = 0;
    }
    else {
      uVar6 = 0;
      local_48 = 0;
      do {
        uVar7 = uVar6 + 0x3f;
        if (-1 < (long)uVar6) {
          uVar7 = uVar6;
        }
        uVar8 = local_48 | 1L << (uVar6 & 0x3f);
        local_48 = local_48 & ~(1L << (uVar6 & 0x3f));
        if ((p_Var1[((long)uVar7 >> 6) +
                    (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
             >> (uVar6 & 0x3f) & 1) != 0) {
          local_48 = uVar8;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar9);
      local_48 = local_48 & 0xffffffffffffff7f;
    }
    std::ostream::write((char *)(lVar5 + 0x10),(long)&local_48);
    local_3c = (int)(this->_residual / (double)ABS(local_38));
  }
  else {
    local_48 = local_48 & 0xffffffff00000000;
    local_3c = -0x4080;
    pcVar4 = (char *)(lVar5 + 0x10);
    std::ostream::write(pcVar4,(long)&local_48);
    std::ostream::write(pcVar4,(long)&local_48);
    std::ostream::write(pcVar4,(long)&local_48);
    std::ostream::write(pcVar4,(long)&local_48);
  }
  sVar3 = std::ostream::write((char *)(lVar5 + 0x10),(long)&local_3c);
  return sVar3;
}

Assistant:

void ezc3d::DataNS::Points3dNS::Point::write(std::fstream &f,
                                             float scaleFactor) const {
  if (residual() >= 0) {
    for (size_t i = 0; i < size(); ++i) {
      float data(static_cast<float>(_data[i]));
      f.write(reinterpret_cast<const char *>(&data), ezc3d::DATA_TYPE::FLOAT);
    }
    std::bitset<8> cameraMasksBits;
    for (size_t i = 0; i < _cameraMasks.size(); ++i) {
      if (_cameraMasks[i]) {
        cameraMasksBits[i] = 1;
      } else {
        cameraMasksBits[i] = 0;
      }
    }
    cameraMasksBits[7] = 0;
    size_t cameraMasks(cameraMasksBits.to_ulong());
    f.write(reinterpret_cast<const char *>(&cameraMasks),
            ezc3d::DATA_TYPE::WORD);
    int residual(static_cast<int>(_residual / fabsf(scaleFactor)));
    f.write(reinterpret_cast<const char *>(&residual), ezc3d::DATA_TYPE::WORD);
  } else {
    float zero(0);
    int minusOne(-16512); // 0xbf80 - 0xFFFF - 1   This is the Qualisys and
                          // Vicon value for missing marker);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::FLOAT);
    f.write(reinterpret_cast<const char *>(&zero), ezc3d::DATA_TYPE::WORD);
    f.write(reinterpret_cast<const char *>(&minusOne), ezc3d::DATA_TYPE::WORD);
  }
}